

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

size_t n_occurences(int *array,size_t length,int needle)

{
  ulong local_30;
  size_t i;
  size_t sum;
  int needle_local;
  size_t length_local;
  int *array_local;
  
  i = 0;
  for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
    if (array[local_30] == needle) {
      i = i + 1;
    }
  }
  return i;
}

Assistant:

size_t n_occurences(const int* array, const size_t length, const int needle) {
  size_t sum = 0;
  for (size_t i = 0; i < length; i++) {
    if (array[i] == needle) {
      sum++;
    }
  }
  return sum;
}